

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O3

void __thiscall
jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>::~algo
          (algo<jwt::algorithm::rs256> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_algo_base)._vptr_algo_base = (_func_int **)&PTR__algo_00113c50;
  pcVar2 = (this->alg).super_rsa.alg_name._M_dataplus._M_p;
  paVar1 = &(this->alg).super_rsa.alg_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->alg).super_rsa.pkey.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual void verify(const std::string& data, const std::string& sig) override {
				alg.verify(data, sig);
			}